

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderBuiltinPrecisionTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::
BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
::iterate(TestStatus *__return_storage_ptr__,
         BuiltinPrecisionCaseTestInstance<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>,_vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>
         *this)

{
  FloatFormat *fmt;
  double *pdVar1;
  _Rb_tree_header *p_Var2;
  Precision PVar3;
  Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  *this_00;
  TestLog *pTVar4;
  Statement *pSVar5;
  ShaderExecutor *pSVar6;
  undefined7 uVar7;
  int iVar8;
  MessageBuilder *this_01;
  _Base_ptr p_Var9;
  IVal *pIVar10;
  IVal *pIVar11;
  long lVar12;
  size_t sVar13;
  TestStatus *__return_storage_ptr___00;
  IVal *pIVar14;
  string *psVar15;
  FloatFormat *pFVar16;
  ostringstream *this_02;
  long lVar17;
  bool bVar18;
  byte bVar19;
  deUint32 in_stack_fffffffffffffa78;
  IVal reference1;
  int numErrors;
  size_t local_550;
  TestStatus *local_548;
  IVal in2;
  ulong local_520;
  Environment env;
  FloatFormat highpFmt;
  void *outputArr [2];
  FuncSet funcs;
  void *inputArr [4];
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_> outputs;
  IVal in3;
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  inputs;
  IVal in0;
  ResultCollector status;
  ostringstream oss;
  
  bVar19 = 0;
  this_00 = this->m_samplings;
  fmt = &(this->m_caseCtx).floatFormat;
  PVar3 = (this->m_caseCtx).precision;
  sVar13 = (this->m_caseCtx).numRandoms;
  local_548 = __return_storage_ptr__;
  iVar8 = tcu::CommandLine::getBaseSeed(((this->m_caseCtx).testContext)->m_cmdLine);
  generateInputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,4>,tcu::Vector<int,4>,vkt::shaderexecutor::Void,vkt::shaderexecutor::Void>>
            (&inputs,(shaderexecutor *)this_00,
             (Samplings<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
              *)fmt,(FloatFormat *)(ulong)PVar3,(Precision)sVar13,(ulong)(iVar8 + 0xdeadbeef),
             in_stack_fffffffffffffa78);
  sVar13 = (long)inputs.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)inputs.in0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start >> 4;
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::Outputs
            (&outputs,sVar13);
  highpFmt.m_maxValue = (this->m_caseCtx).highpFormat.m_maxValue;
  highpFmt.m_minExp = (this->m_caseCtx).highpFormat.m_minExp;
  highpFmt.m_maxExp = (this->m_caseCtx).highpFormat.m_maxExp;
  highpFmt.m_fractionBits = (this->m_caseCtx).highpFormat.m_fractionBits;
  highpFmt.m_hasSubnormal = (this->m_caseCtx).highpFormat.m_hasSubnormal;
  highpFmt.m_hasInf = (this->m_caseCtx).highpFormat.m_hasInf;
  highpFmt.m_hasNaN = (this->m_caseCtx).highpFormat.m_hasNaN;
  highpFmt.m_exactPrecision = (this->m_caseCtx).highpFormat.m_exactPrecision;
  highpFmt._25_7_ = *(undefined7 *)&(this->m_caseCtx).highpFormat.field_0x19;
  numErrors = 0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &env.m_map._M_t._M_impl.super__Rb_tree_header._M_header;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_550 = sVar13;
  env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       env.m_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  tcu::ResultCollector::ResultCollector(&status);
  pTVar4 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  inputArr[0] = inputs.in0.
                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  inputArr[1] = inputs.in1.
                super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                _M_impl.super__Vector_impl_data._M_start;
  inputArr[2] = inputs.in2.
                super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  inputArr[3] = inputs.in3.
                super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                ._M_impl.super__Vector_impl_data._M_start;
  outputArr[0] = outputs.out0.
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  outputArr[1] = outputs.out1.
                 super__Vector_base<vkt::shaderexecutor::Void,_std::allocator<vkt::shaderexecutor::Void>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pdVar1 = &in0.m_data[0].m_lo;
  in0.m_data[0]._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::operator<<((ostream *)pdVar1,"Statement: ");
  this_01 = tcu::MessageBuilder::operator<<((MessageBuilder *)&in0,&this->m_stmt);
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
  p_Var2 = &funcs._M_t._M_impl.super__Rb_tree_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  funcs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
  funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
  (*pSVar5->_vptr_Statement[4])(pSVar5,&funcs);
  for (p_Var9 = funcs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var9 != p_Var2; p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
    (**(code **)(**(long **)(p_Var9 + 1) + 0x30))(*(long **)(p_Var9 + 1),&oss);
  }
  if (funcs._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    pdVar1 = &in0.m_data[0].m_lo;
    in0.m_data[0]._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
    std::operator<<((ostream *)pdVar1,"Reference definitions:\n");
    std::__cxx11::stringbuf::str();
    std::operator<<((ostream *)pdVar1,(string *)&in2);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::string::~string((string *)&in2);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  }
  std::
  _Rb_tree<const_vkt::shaderexecutor::FuncBase_*,_const_vkt::shaderexecutor::FuncBase_*,_std::_Identity<const_vkt::shaderexecutor::FuncBase_*>,_std::less<const_vkt::shaderexecutor::FuncBase_*>,_std::allocator<const_vkt::shaderexecutor::FuncBase_*>_>
  ::~_Rb_tree(&funcs._M_t);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
  local_520 = local_550;
  pSVar6 = (this->m_executor).
           super_UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
           .m_data.ptr;
  pIVar10 = (IVal *)outputArr;
  (*pSVar6->_vptr_ShaderExecutor[2])(pSVar6,local_550 & 0xffffffff,inputArr,pIVar10,0);
  tcu::Vector<tcu::Interval,_4>::Vector(&in0);
  tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)&oss);
  tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)&funcs);
  Environment::bind<tcu::Vector<float,4>>
            (&env,(this->m_variables).in0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr,&in0);
  Environment::bind<tcu::Vector<int,4>>
            (&env,(this->m_variables).in1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>.m_ptr,
             (IVal *)&oss);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).in2.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&in2);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).in3.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&in3);
  Environment::bind<tcu::Vector<float,4>>
            (&env,(this->m_variables).out0.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                  m_ptr,(IVal *)&funcs);
  Environment::bind<vkt::shaderexecutor::Void>
            (&env,(this->m_variables).out1.
                  super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>.
                  m_ptr,&reference1);
  lVar17 = 0;
  iVar8 = 0;
  while (bVar18 = local_520 != 0, local_520 = local_520 - 1, bVar18) {
    tcu::Vector<tcu::Interval,_4>::Vector((Vector<tcu::Interval,_4> *)&oss);
    round<tcu::Vector<float,4>>
              ((IVal *)&funcs,(shaderexecutor *)fmt,
               (FloatFormat *)
               ((long)(inputs.in0.
                       super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),
               (Vector<float,_4> *)pIVar10);
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
              (&in0,fmt,(IVal *)&funcs);
    pIVar10 = Environment::lookup<tcu::Vector<float,4>>
                        (&env,(this->m_variables).in0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                              .m_ptr);
    pIVar14 = &in0;
    for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
      uVar7 = *(undefined7 *)&pIVar14->m_data[0].field_0x1;
      pIVar10->m_data[0].m_hasNaN = pIVar14->m_data[0].m_hasNaN;
      *(undefined7 *)&pIVar10->m_data[0].field_0x1 = uVar7;
      pIVar14 = (IVal *)((long)pIVar14 + ((ulong)bVar19 * -2 + 1) * 8);
      pIVar10 = (IVal *)((long)pIVar10 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    round<tcu::Vector<int,4>>
              ((IVal *)&funcs,(shaderexecutor *)fmt,
               (FloatFormat *)
               ((long)(inputs.in1.
                       super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),
               (Vector<int,_4> *)0x0);
    ContainerTraits<tcu::Vector<int,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
              (&in0,fmt,(IVal *)&funcs);
    pIVar11 = Environment::lookup<tcu::Vector<int,4>>
                        (&env,(this->m_variables).in1.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>
                              .m_ptr);
    pIVar14 = &in0;
    for (lVar12 = 0xc; lVar12 != 0; lVar12 = lVar12 + -1) {
      uVar7 = *(undefined7 *)&pIVar14->m_data[0].field_0x1;
      pIVar11->m_data[0].m_hasNaN = pIVar14->m_data[0].m_hasNaN;
      *(undefined7 *)&pIVar11->m_data[0].field_0x1 = uVar7;
      pIVar14 = (IVal *)((long)pIVar14 + ((ulong)bVar19 * -2 + 1) * 8);
      pIVar11 = (IVal *)((long)pIVar11 + ((ulong)bVar19 * -2 + 1) * 8);
    }
    Environment::lookup<vkt::shaderexecutor::Void>
              (&env,(this->m_variables).in2.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                    .m_ptr);
    Environment::lookup<vkt::shaderexecutor::Void>
              (&env,(this->m_variables).in3.
                    super_SharedPtr<const_vkt::shaderexecutor::Variable<vkt::shaderexecutor::Void>_>
                    .m_ptr);
    in0.m_data[1].m_hi._0_4_ = (this->m_caseCtx).precision;
    in0.m_data[1].m_lo = (this->m_caseCtx).floatFormat.m_maxValue;
    in0.m_data[0]._0_8_ = *(undefined8 *)fmt;
    in0.m_data[0].m_lo._0_4_ = (this->m_caseCtx).floatFormat.m_fractionBits;
    in0.m_data[0].m_lo._4_4_ = (this->m_caseCtx).floatFormat.m_hasSubnormal;
    in0.m_data[0].m_hi._0_4_ = (this->m_caseCtx).floatFormat.m_hasInf;
    in0.m_data[0].m_hi._4_4_ = (this->m_caseCtx).floatFormat.m_hasNaN;
    in0.m_data[1].m_hasNaN = (this->m_caseCtx).floatFormat.m_exactPrecision;
    in0.m_data[1]._1_3_ = *(undefined3 *)&(this->m_caseCtx).floatFormat.field_0x19;
    in0.m_data[1]._4_4_ = *(undefined4 *)&(this->m_caseCtx).floatFormat.field_0x1c;
    in0.m_data[2].m_lo._0_4_ = 0;
    pSVar5 = (this->m_stmt).super_SharedPtr<const_vkt::shaderexecutor::Statement>.m_ptr;
    in0.m_data[2]._0_8_ = &env;
    (*pSVar5->_vptr_Statement[3])(pSVar5,&in0);
    pIVar10 = Environment::lookup<tcu::Vector<float,4>>
                        (&env,(this->m_variables).out0.
                              super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>
                              .m_ptr);
    ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doConvert
              (&in0,&highpFmt,pIVar10);
    psVar15 = (string *)&in0;
    pFVar16 = (FloatFormat *)&oss;
    for (pIVar10 = (IVal *)0xc; pIVar10 != (IVal *)0x0;
        pIVar10 = (IVal *)((long)&pIVar10[-1].m_data[3].m_hi + 7)) {
      *(pointer *)pFVar16 = (psVar15->_M_dataplus)._M_p;
      psVar15 = (string *)((long)psVar15 + (ulong)bVar19 * -0x10 + 8);
      pFVar16 = (FloatFormat *)((long)pFVar16 + (ulong)bVar19 * -0x10 + 8);
    }
    bVar18 = ContainerTraits<tcu::Vector<float,_4>,_tcu::Vector<tcu::Interval,_4>_>::doContains
                       ((IVal *)&oss,
                        (Vector<float,_4> *)
                        ((long)(outputs.out0.
                                super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                                ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17));
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&in0,"Shader output 0 is outside acceptable range",
               (allocator<char> *)&funcs);
    bVar18 = tcu::ResultCollector::check(&status,bVar18,(string *)&in0);
    std::__cxx11::string::~string((string *)&in0);
    if (!bVar18) {
      iVar8 = iVar8 + 1;
      pdVar1 = &in0.m_data[0].m_lo;
      numErrors = iVar8;
      if (iVar8 < 0x65) {
        in0.m_data[0]._0_8_ = pTVar4;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
        std::operator<<((ostream *)pdVar1,"Failed");
        std::operator<<((ostream *)pdVar1," sample:\n");
        std::operator<<((ostream *)pdVar1,"\t");
        std::__cxx11::string::string
                  ((string *)&funcs,
                   (string *)
                   &((this->m_variables).in0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)pdVar1,(string *)&funcs);
        std::operator<<((ostream *)pdVar1," = ");
        valueToString<tcu::Vector<float,4>>
                  ((string *)&in2,(shaderexecutor *)&highpFmt,
                   (FloatFormat *)
                   ((long)(inputs.in0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),
                   (Vector<float,_4> *)pIVar10);
        std::operator<<((ostream *)pdVar1,(string *)&in2);
        std::operator<<((ostream *)pdVar1,"\n");
        std::__cxx11::string::~string((string *)&in2);
        std::__cxx11::string::~string((string *)&funcs);
        std::operator<<((ostream *)pdVar1,"\t");
        std::__cxx11::string::string
                  ((string *)&funcs,
                   (string *)
                   &((this->m_variables).in1.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<int,_4>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)pdVar1,(string *)&funcs);
        std::operator<<((ostream *)pdVar1," = ");
        valueToString<tcu::Vector<int,4>>
                  ((string *)&in2,(shaderexecutor *)&highpFmt,
                   (FloatFormat *)
                   ((long)(inputs.in1.
                           super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),
                   (Vector<int,_4> *)pIVar10);
        std::operator<<((ostream *)pdVar1,(string *)&in2);
        std::operator<<((ostream *)pdVar1,"\n");
        std::__cxx11::string::~string((string *)&in2);
        std::__cxx11::string::~string((string *)&funcs);
        std::operator<<((ostream *)pdVar1,"\t");
        std::__cxx11::string::string
                  ((string *)&funcs,
                   (string *)
                   &((this->m_variables).out0.
                     super_SharedPtr<const_vkt::shaderexecutor::Variable<tcu::Vector<float,_4>_>_>.
                    m_ptr)->m_name);
        std::operator<<((ostream *)pdVar1,(string *)&funcs);
        std::operator<<((ostream *)pdVar1," = ");
        valueToString<tcu::Vector<float,4>>
                  ((string *)&in2,(shaderexecutor *)&highpFmt,
                   (FloatFormat *)
                   ((long)(outputs.out0.
                           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->m_data + lVar17),
                   (Vector<float,_4> *)pIVar10);
        std::operator<<((ostream *)pdVar1,(string *)&in2);
        std::operator<<((ostream *)pdVar1,"\n");
        std::operator<<((ostream *)pdVar1,"\tExpected range: ");
        intervalToString<tcu::Vector<float,4>>
                  ((string *)&in3,(shaderexecutor *)&highpFmt,(FloatFormat *)&oss,pIVar10);
        std::operator<<((ostream *)pdVar1,(string *)&in3);
        std::operator<<((ostream *)pdVar1,"\n");
        std::__cxx11::string::~string((string *)&in3);
        std::__cxx11::string::~string((string *)&in2);
        std::__cxx11::string::~string((string *)&funcs);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
      }
    }
    lVar17 = lVar17 + 0x10;
  }
  if (iVar8 < 0x65) {
    if (iVar8 == 0) {
      pdVar1 = &in0.m_data[0].m_lo;
      in0.m_data[0]._0_8_ = pTVar4;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
      std::operator<<((ostream *)pdVar1,"All ");
      std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
      std::operator<<((ostream *)pdVar1," inputs passed.");
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&in0,"Pass",(allocator<char> *)&oss);
      __return_storage_ptr___00 = local_548;
      tcu::TestStatus::pass(local_548,(string *)&in0);
      this_02 = (ostringstream *)&in0;
      goto LAB_00892c62;
    }
  }
  else {
    pdVar1 = &in0.m_data[0].m_lo;
    in0.m_data[0]._0_8_ = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
    std::operator<<((ostream *)pdVar1,"(Skipped ");
    std::ostream::operator<<(pdVar1,iVar8 + -100);
    std::operator<<((ostream *)pdVar1," messages.)");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  }
  pdVar1 = &in0.m_data[0].m_lo;
  in0.m_data[0]._0_8_ = pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pdVar1);
  std::ostream::operator<<(pdVar1,iVar8);
  std::operator<<((ostream *)pdVar1,"/");
  std::ostream::_M_insert<unsigned_long>((ulong)pdVar1);
  std::operator<<((ostream *)pdVar1," inputs failed.");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&in0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pdVar1);
  de::toString<int>((string *)&oss,&numErrors);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&funcs," test failed. Check log for the details",(allocator<char> *)&in2);
  __return_storage_ptr___00 = local_548;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&funcs);
  tcu::TestStatus::fail(__return_storage_ptr___00,(string *)&in0);
  std::__cxx11::string::~string((string *)&in0);
  std::__cxx11::string::~string((string *)&funcs);
  this_02 = &oss;
LAB_00892c62:
  std::__cxx11::string::~string((string *)this_02);
  tcu::ResultCollector::~ResultCollector(&status);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_de::SharedPtr<unsigned_char>_>_>_>
               *)&env);
  Outputs<vkt::shaderexecutor::OutTypes<tcu::Vector<float,_4>,_vkt::shaderexecutor::Void>_>::
  ~Outputs(&outputs);
  Inputs<vkt::shaderexecutor::InTypes<tcu::Vector<float,_4>,_tcu::Vector<int,_4>,_vkt::shaderexecutor::Void,_vkt::shaderexecutor::Void>_>
  ::~Inputs(&inputs);
  return __return_storage_ptr___00;
}

Assistant:

tcu::TestStatus BuiltinPrecisionCaseTestInstance<In, Out>::iterate (void)
{
	typedef typename	In::In0		In0;
	typedef typename	In::In1		In1;
	typedef typename	In::In2		In2;
	typedef typename	In::In3		In3;
	typedef typename	Out::Out0	Out0;
	typedef typename	Out::Out1	Out1;

	Inputs<In>			inputs		= generateInputs(m_samplings, m_caseCtx.floatFormat, m_caseCtx.precision, m_caseCtx.numRandoms, 0xdeadbeefu + m_caseCtx.testContext.getCommandLine().getBaseSeed());
	const FloatFormat&	fmt			= m_caseCtx.floatFormat;
	const int			inCount		= numInputs<In>();
	const int			outCount	= numOutputs<Out>();
	const size_t		numValues	= (inCount > 0) ? inputs.in0.size() : 1;
	Outputs<Out>		outputs		(numValues);
	const FloatFormat	highpFmt	= m_caseCtx.highpFormat;
	const int			maxMsgs		= 100;
	int					numErrors	= 0;
	Environment			env;		// Hoisted out of the inner loop for optimization.
	ResultCollector		status;
	TestLog&			testLog		= m_context.getTestContext().getLog();

	const void*			inputArr[]	=
	{
		&inputs.in0.front(), &inputs.in1.front(), &inputs.in2.front(), &inputs.in3.front(),
	};
	void*				outputArr[]	=
	{
		&outputs.out0.front(), &outputs.out1.front(),
	};

	// Print out the statement and its definitions
	testLog << TestLog::Message << "Statement: " << m_stmt << TestLog::EndMessage;
	{
		ostringstream	oss;
		FuncSet			funcs;

		m_stmt->getUsedFuncs(funcs);
		for (FuncSet::const_iterator it = funcs.begin(); it != funcs.end(); ++it)
		{
			(*it)->printDefinition(oss);
		}
		if (!funcs.empty())
			testLog << TestLog::Message << "Reference definitions:\n" << oss.str()
				  << TestLog::EndMessage;
	}

	switch (inCount)
	{
		case 4: DE_ASSERT(inputs.in3.size() == numValues);
		case 3: DE_ASSERT(inputs.in2.size() == numValues);
		case 2: DE_ASSERT(inputs.in1.size() == numValues);
		case 1: DE_ASSERT(inputs.in0.size() == numValues);
		default: break;
	}

	m_executor->execute(int(numValues), inputArr, outputArr);

	// Initialize environment with dummy values so we don't need to bind in inner loop.
	{
		const typename Traits<In0>::IVal		in0;
		const typename Traits<In1>::IVal		in1;
		const typename Traits<In2>::IVal		in2;
		const typename Traits<In3>::IVal		in3;
		const typename Traits<Out0>::IVal		reference0;
		const typename Traits<Out1>::IVal		reference1;

		env.bind(*m_variables.in0, in0);
		env.bind(*m_variables.in1, in1);
		env.bind(*m_variables.in2, in2);
		env.bind(*m_variables.in3, in3);
		env.bind(*m_variables.out0, reference0);
		env.bind(*m_variables.out1, reference1);
	}

	// For each input tuple, compute output reference interval and compare
	// shader output to the reference.
	for (size_t valueNdx = 0; valueNdx < numValues; valueNdx++)
	{
		bool						result		= true;
		typename Traits<Out0>::IVal	reference0;
		typename Traits<Out1>::IVal	reference1;

		env.lookup(*m_variables.in0) = convert<In0>(fmt, round(fmt, inputs.in0[valueNdx]));
		env.lookup(*m_variables.in1) = convert<In1>(fmt, round(fmt, inputs.in1[valueNdx]));
		env.lookup(*m_variables.in2) = convert<In2>(fmt, round(fmt, inputs.in2[valueNdx]));
		env.lookup(*m_variables.in3) = convert<In3>(fmt, round(fmt, inputs.in3[valueNdx]));

		{
			EvalContext	ctx (fmt, m_caseCtx.precision, env);
			m_stmt->execute(ctx);
		}

		switch (outCount)
		{
			case 2:
				reference1 = convert<Out1>(highpFmt, env.lookup(*m_variables.out1));
				if (!status.check(contains(reference1, outputs.out1[valueNdx]),
									"Shader output 1 is outside acceptable range"))
					result = false;
			case 1:
				reference0 = convert<Out0>(highpFmt, env.lookup(*m_variables.out0));
				if (!status.check(contains(reference0, outputs.out0[valueNdx]),
									"Shader output 0 is outside acceptable range"))
					result = false;
			default: break;
		}

		if (!result)
			++numErrors;

		if ((!result && numErrors <= maxMsgs) || GLS_LOG_ALL_RESULTS)
		{
			MessageBuilder	builder	= testLog.message();

			builder << (result ? "Passed" : "Failed") << " sample:\n";

			if (inCount > 0)
			{
				builder << "\t" << m_variables.in0->getName() << " = "
						<< valueToString(highpFmt, inputs.in0[valueNdx]) << "\n";
			}

			if (inCount > 1)
			{
				builder << "\t" << m_variables.in1->getName() << " = "
						<< valueToString(highpFmt, inputs.in1[valueNdx]) << "\n";
			}

			if (inCount > 2)
			{
				builder << "\t" << m_variables.in2->getName() << " = "
						<< valueToString(highpFmt, inputs.in2[valueNdx]) << "\n";
			}

			if (inCount > 3)
			{
				builder << "\t" << m_variables.in3->getName() << " = "
						<< valueToString(highpFmt, inputs.in3[valueNdx]) << "\n";
			}

			if (outCount > 0)
			{
				builder << "\t" << m_variables.out0->getName() << " = "
						<< valueToString(highpFmt, outputs.out0[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out0>(highpFmt, reference0) << "\n";
			}

			if (outCount > 1)
			{
				builder << "\t" << m_variables.out1->getName() << " = "
						<< valueToString(highpFmt, outputs.out1[valueNdx]) << "\n"
						<< "\tExpected range: "
						<< intervalToString<typename Out::Out1>(highpFmt, reference1) << "\n";
			}

			builder << TestLog::EndMessage;
		}
	}

	if (numErrors > maxMsgs)
	{
		testLog << TestLog::Message << "(Skipped " << (numErrors - maxMsgs) << " messages.)"
			  << TestLog::EndMessage;
	}

	if (numErrors == 0)
	{
		testLog << TestLog::Message << "All " << numValues << " inputs passed."
			  << TestLog::EndMessage;
	}
	else
	{
		testLog << TestLog::Message << numErrors << "/" << numValues << " inputs failed."
			  << TestLog::EndMessage;
	}

	if (numErrors)
		return tcu::TestStatus::fail(de::toString(numErrors) + string(" test failed. Check log for the details"));
	else
		return tcu::TestStatus::pass("Pass");

}